

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.cpp
# Opt level: O2

uint Security::CalculateConstSize(Opnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  int32 value;
  uint uVar4;
  AddrOpnd *pAVar5;
  IntConstOpnd *pIVar6;
  IndirOpnd *pIVar7;
  undefined4 *puVar8;
  Var aValue;
  
  bVar2 = DontEncode(opnd);
  if (bVar2) {
    return 0;
  }
  OVar3 = IR::Opnd::GetKind(opnd);
  switch(OVar3) {
  case OpndKindIntConst:
    pIVar6 = IR::Opnd::AsIntConstOpnd(opnd);
    break;
  case OpndKindInt64Const:
    pIVar6 = (IntConstOpnd *)IR::Opnd::AsInt64ConstOpnd(opnd);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Security.cpp"
                       ,0x15e,"((0))","(0)");
    if (bVar2) {
      *puVar8 = 0;
      return 0;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  case OpndKindAddr:
    pAVar5 = IR::Opnd::AsAddrOpnd(opnd);
    bVar2 = Js::TaggedInt::Is(pAVar5->m_address);
    aValue = pAVar5->m_address;
    if (bVar2) {
      value = Js::TaggedInt::ToInt32(aValue);
      goto LAB_005b1e8a;
    }
    goto LAB_005b1e74;
  case OpndKindIndir:
    pIVar7 = IR::Opnd::AsIndirOpnd(opnd);
    value = pIVar7->m_offset;
LAB_005b1e8a:
    uVar4 = GetByteCount<int>(value);
    return uVar4;
  }
  aValue = (Var)(pIVar6->super_EncodableOpnd<long>).m_value;
LAB_005b1e74:
  uVar4 = GetByteCount<long>((long)aValue);
  return uVar4;
}

Assistant:

uint
Security::CalculateConstSize(IR::Opnd *opnd)
{
    if (DontEncode(opnd))
    {
        return 0;
    }
    switch (opnd->GetKind())
    {
#if TARGET_64
    case IR::OpndKindInt64Const:
    {
        IR::Int64ConstOpnd *intConstOpnd = opnd->AsInt64ConstOpnd();
        return GetByteCount(intConstOpnd->GetValue());
    }
#endif
    case IR::OpndKindIntConst:
    {
        IR::IntConstOpnd *intConstOpnd = opnd->AsIntConstOpnd();
        return GetByteCount(intConstOpnd->GetValue());
    }
    case IR::OpndKindAddr:
    {
        IR::AddrOpnd *addrOpnd = opnd->AsAddrOpnd();
        return Js::TaggedInt::Is(addrOpnd->m_address) ? GetByteCount(Js::TaggedInt::ToInt32(addrOpnd->m_address)) : GetByteCount((intptr_t)addrOpnd->m_address);
    }
    case IR::OpndKindIndir:
    {
        IR::IndirOpnd * indirOpnd = opnd->AsIndirOpnd();
        return GetByteCount(indirOpnd->GetOffset());
    }
    default:
        Assume(UNREACHED);
    }
    return 0;
}